

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddRef.c
# Opt level: O1

void Cudd_IterDerefBdd(DdManager *table,DdNode *n)

{
  uint *puVar1;
  int iVar2;
  DdNode **ppDVar3;
  uint uVar4;
  int iVar5;
  DdNode *pDVar6;
  anon_union_16_2_50f58667_for_type *paVar7;
  
  uVar4 = table->keys - table->dead;
  if (table->peakLiveNodes < uVar4) {
    table->peakLiveNodes = uVar4;
  }
  ppDVar3 = table->stack;
  pDVar6 = (DdNode *)((ulong)n & 0xfffffffffffffffe);
  iVar5 = 1;
  do {
    if (pDVar6->ref == 1) {
      pDVar6->ref = 0;
      table->dead = table->dead + 1;
      iVar2 = table->perm[pDVar6->index];
      paVar7 = &pDVar6->type;
      ppDVar3[iVar5] = (DdNode *)((ulong)(pDVar6->type).kids.E & 0xfffffffffffffffe);
      puVar1 = &table->subtables[iVar2].dead;
      *puVar1 = *puVar1 + 1;
      iVar5 = iVar5 + 1;
    }
    else {
      pDVar6->ref = pDVar6->ref - 1;
      paVar7 = (anon_union_16_2_50f58667_for_type *)(ppDVar3 + (long)iVar5 + -1);
      iVar5 = iVar5 + -1;
    }
    pDVar6 = (paVar7->kids).T;
  } while (iVar5 != 0);
  return;
}

Assistant:

void
Cudd_IterDerefBdd(
  DdManager * table,
  DdNode * n)
{
    DdNode *N;
    int ord;
    DdNodePtr *stack = table->stack;
    int SP = 1;

    unsigned int live = table->keys - table->dead;
    if (live > table->peakLiveNodes) {
        table->peakLiveNodes = live;
    }

    N = Cudd_Regular(n);

    do {
#ifdef DD_DEBUG
        assert(N->ref != 0);
#endif

        if (N->ref == 1) {
            N->ref = 0;
            table->dead++;
#ifdef DD_STATS
            table->nodesDropped++;
#endif
            ord = table->perm[N->index];
            stack[SP++] = Cudd_Regular(cuddE(N));
            table->subtables[ord].dead++;
            N = cuddT(N);
        } else {
            cuddSatDec(N->ref);
            N = stack[--SP];
        }
    } while (SP != 0);

}